

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

double __thiscall
imrt::EvaluationFunction::get_ratio_beamlet
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int angle,int b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  reference ppVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int in_R9D;
  Matrix *Dep;
  int k;
  int o;
  pair<const_double,_std::pair<int,_int>_> voxel;
  iterator __end1;
  iterator __begin1;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  *__range1;
  double O;
  double T;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double ev;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Volume *in_stack_fffffffffffffec0;
  double dVar10;
  double local_d8;
  double local_d0 [3];
  Matrix *local_b8;
  int local_b0;
  int local_ac;
  double local_a8;
  pair<int,_int> pStack_a0;
  _Self local_90;
  _Self local_88;
  undefined1 *local_80;
  double local_78;
  double local_70;
  pair<int,_int> local_68;
  undefined1 local_60 [48];
  undefined8 local_30;
  int local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_30 = 0;
  local_28 = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_68 = std::make_pair<int&,int&>
                       ((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                        (int *)0x125250);
  std::
  unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
  ::operator[]((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
                *)in_stack_fffffffffffffec0,
               (key_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)in_stack_fffffffffffffec0,
             (multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_70 = 0.0;
  local_78 = 0.0;
  local_80 = local_60;
  local_88._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::begin((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_90._M_node =
       (_Base_ptr)
       std::
       multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
       ::end((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  while( true ) {
    bVar4 = std::operator!=(&local_88,&local_90);
    if (!bVar4) break;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
                        0x1252f7);
    local_a8 = ppVar5->first;
    pStack_a0 = ppVar5->second;
    local_ac = pStack_a0.first;
    local_b0 = pStack_a0.second;
    std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[]
              (*(vector<imrt::Volume,_std::allocator<imrt::Volume>_> **)(in_RDI + 0x40),
               (long)pStack_a0.first);
    local_b8 = Volume::getDepositionMatrix(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
    if (*pvVar6 <= 0.0) {
      dVar3 = maths::Matrix::operator()(local_b8,local_b0,local_28);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_ac);
      dVar10 = *pvVar6;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_ac);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_b0);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_ac);
      dVar2 = *pvVar6;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_ac);
      local_78 = (dVar3 * dVar10 * (dVar1 / dVar2 + 1.0)) / (double)*pvVar8 + local_78;
    }
    else {
      dVar3 = maths::Matrix::operator()(local_b8,local_b0,local_28);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_ac);
      dVar10 = *pvVar6;
      pvVar7 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)local_ac);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(long)local_b0);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_ac);
      dVar2 = *pvVar6;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_ac);
      local_d0[0] = (dVar3 * dVar10 * (1.0 - dVar1 / dVar2)) / (double)*pvVar8;
      local_d8 = 0.0;
      pdVar9 = std::max<double>(local_d0,&local_d8);
      local_70 = *pdVar9 + local_70;
    }
    std::_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_double,_std::pair<int,_int>_>_> *)
               in_stack_fffffffffffffec0);
  }
  dVar10 = local_70 / local_78;
  std::
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~multimap((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
               *)0x1255ec);
  return dVar10;
}

Assistant:

double EvaluationFunction::get_ratio_beamlet(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, int angle, int b){
			double ev=0;
			multimap<double, pair<int,int> > voxels = beamlet2voxel_list[make_pair(angle,b)];
			double T=0.0,O=0.0;
			for(auto voxel:voxels){
				int o=voxel.second.first;
				int k=voxel.second.second;
				const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);

				if(Zmin[o]>0){
					 T += max(Dep(k,b) * w[o]*(1.0 - Z[o][k]/Zmin[o])/nb_voxels[o],0.0);
				}else
					 O += Dep(k,b) * w[o]*(1.0 + Z[o][k]/Zmax[o])/nb_voxels[o];

			}
			//cout << T << "," << O << endl;
			return (T/O);
}